

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:940:38),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:945:6)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:940:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:945:6)>
          *this,ExceptionOrValue *output)

{
  ResponseHook *pRVar1;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  depResult;
  ExceptionOr<kj::_::Void> local_390;
  ExceptionOrValue local_1f0;
  char local_58;
  Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  local_50;
  
  local_1f0.exception.ptr.isSet = false;
  local_58 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f0);
  if (local_1f0.exception.ptr.isSet == true) {
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  else {
    if (local_58 != '\x01') goto LAB_00183456;
    anon_class_1_0_00000001_for_func::operator()((anon_class_1_0_00000001_for_func *)this,&local_50)
    ;
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  if (local_390.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_390.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00183456:
  pRVar1 = local_50.hook.ptr;
  if ((local_58 == '\x01') && (local_50.hook.ptr != (ResponseHook *)0x0)) {
    local_50.hook.ptr = (ResponseHook *)0x0;
    (**(local_50.hook.disposer)->_vptr_Disposer)
              (local_50.hook.disposer,
               (_func_int *)
               ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2]));
  }
  if (local_1f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }